

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowControl.hpp
# Opt level: O3

void InstructionSet::x86::Primitive::
     ret_far<InstructionSet::x86::Instruction<false>,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)1>::Context>
               (Instruction<false> instruction,Context *context)

{
  undefined2 uVar1;
  Registers *pRVar2;
  Segments *pSVar3;
  type_conflict2 tVar4;
  type_conflict2 tVar5;
  short local_2c [2];
  
  tVar4 = PCCompatible::Memory::access<unsigned_short,(InstructionSet::x86::AccessType)3>
                    (&context->memory,SS,(context->registers).sp_);
  uVar1 = (context->registers).sp_;
  (context->registers).sp_ = uVar1 + 2;
  tVar5 = PCCompatible::Memory::access<unsigned_short,(InstructionSet::x86::AccessType)3>
                    (&context->memory,SS,uVar1 + 2);
  local_2c[0] = 0;
  local_2c[1] = instruction.extensions_[0];
  (context->registers).sp_ =
       (context->registers).sp_ +
       *(short *)((long)local_2c + (ulong)((uint)((ulong)instruction >> 0xc) & 2)) + 2;
  pRVar2 = (context->flow_controller).registers_;
  pRVar2->cs_ = tVar5;
  pSVar3 = (context->flow_controller).segments_;
  pSVar3->cs_base_ = (uint)pSVar3->registers_->cs_ << 4;
  pRVar2->ip_ = tVar4;
  return;
}

Assistant:

void ret_far(
	InstructionT instruction,
	ContextT &context
) {
	context.memory.preauthorise_stack_read(sizeof(uint16_t) * 2);
	const auto ip = pop<uint16_t, true>(context);
	const auto cs = pop<uint16_t, true>(context);
	context.registers.sp() += instruction.operand();
	context.flow_controller.template jump<uint16_t>(cs, ip);
}